

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O2

void __thiscall
yactfr::internal::JsonFlSIntTypeValReq::_validate(JsonFlSIntTypeValReq *this,JsonVal *jsonVal)

{
  JsonFlBitArrayTypeValReq::_validate((JsonFlBitArrayTypeValReq *)this,jsonVal);
  return;
}

Assistant:

void _validate(const JsonVal& jsonVal) const override
    {
        try {
            JsonFlIntTypeValReq::_validate(jsonVal);
        } catch (TextParseError& exc) {
            appendMsgToTextParseError(exc, "Invalid fixed-length signed integer type:",
                                      jsonVal.loc());
            throw;
        }
    }